

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.c
# Opt level: O0

float glmc_aabb_radius(vec3 *box)

{
  float *in_RDI;
  float fVar1;
  
  fVar1 = sqrtf((*in_RDI - in_RDI[3]) * (*in_RDI - in_RDI[3]) +
                (in_RDI[1] - in_RDI[4]) * (in_RDI[1] - in_RDI[4]) +
                (in_RDI[2] - in_RDI[5]) * (in_RDI[2] - in_RDI[5]));
  return fVar1 * 0.5;
}

Assistant:

CGLM_EXPORT
float
glmc_aabb_radius(vec3 box[2]) {
  return glm_aabb_radius(box);
}